

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbuffer.cpp
# Opt level: O2

QByteArray * __thiscall
QBufferPrivate::peek(QByteArray *__return_storage_ptr__,QBufferPrivate *this,qint64 maxSize)

{
  long lVar1;
  QArrayDataPointer<char> *other;
  long size;
  char *pcVar2;
  
  lVar1 = (this->super_QIODevicePrivate).pos;
  other = &this->buf->d;
  if (maxSize < other->size || lVar1 != 0) {
    size = other->size - lVar1;
    if (maxSize <= size) {
      size = maxSize;
    }
    pcVar2 = other->ptr;
    if (pcVar2 == (char *)0x0) {
      pcVar2 = &QByteArray::_empty;
    }
    QByteArray::QByteArray(__return_storage_ptr__,pcVar2 + lVar1,size);
  }
  else {
    QArrayDataPointer<char>::QArrayDataPointer(&__return_storage_ptr__->d,other);
  }
  return __return_storage_ptr__;
}

Assistant:

QByteArray QBufferPrivate::peek(qint64 maxSize)
{
    qint64 readBytes = qMin(maxSize, static_cast<qint64>(buf->size()) - pos);
    if (pos == 0 && maxSize >= buf->size())
        return *buf;
    return QByteArray(buf->constData() + pos, readBytes);
}